

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.cpp
# Opt level: O0

void benchmark<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::vector<double,remora::cpu_tag>>
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *image,vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag>
                       *filter,size_t num_channels,size_t num_filters,size_t image_size1,
               size_t image_size2,size_t filter_size)

{
  undefined1 auVar1 [16];
  matrix<double,_remora::row_major,_remora::cpu_tag> *pmVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  double *pdVar5;
  long lVar6;
  ostream *poVar7;
  ulong in_RCX;
  ulong in_RDX;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDI;
  long in_R8;
  long in_R9;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Timer *in_stack_00000008;
  double flops;
  double mults;
  Timer time;
  size_t i;
  double minOptTime;
  matrix<double,_remora::row_major,_remora::cpu_tag> out;
  size_t output_size2;
  size_t output_size1;
  long in_stack_fffffffffffffe98;
  undefined1 measureWallclockTime;
  Timer *in_stack_fffffffffffffea0;
  value_type *in_stack_fffffffffffffec8;
  size_type in_stack_fffffffffffffed0;
  size_type in_stack_fffffffffffffed8;
  matrix<double,_remora::row_major,_remora::cpu_tag> *in_stack_fffffffffffffee0;
  vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_fffffffffffffee8;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_fffffffffffffef0;
  size_t in_stack_ffffffffffffff10;
  unsigned_long filter_width;
  size_t in_stack_ffffffffffffff30;
  double local_c0 [6];
  unsigned_long local_90 [3];
  double local_78 [7];
  long local_40;
  ulong local_38;
  long local_30;
  ulong local_20;
  ulong local_18;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_8;
  
  local_38 = (in_R8 - (long)in_stack_00000008) + 1;
  local_40 = (in_R9 - (long)in_stack_00000008) + 1;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  pmVar2 = remora::
           matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(in_RDI);
  remora::matrix<double,_remora::row_major,_remora::cpu_tag>::size1(pmVar2);
  local_78[1] = 0.0;
  remora::matrix<double,_remora::row_major,_remora::cpu_tag>::matrix
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  local_78[0] = std::numeric_limits<double>::max();
  local_90[2] = 0;
  while( true ) {
    measureWallclockTime = (undefined1)((ulong)in_stack_fffffffffffffe98 >> 0x38);
    local_90[1] = 1;
    filter_width = local_90[2];
    pmVar2 = remora::
             matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
             ::operator()(local_8);
    sVar3 = remora::matrix<double,_remora::row_major,_remora::cpu_tag>::size1(pmVar2);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3;
    local_90[0] = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x14)) / auVar1,0);
    puVar4 = std::max<unsigned_long>(local_90 + 1,local_90);
    if (filter_width == *puVar4) break;
    Timer::Timer(in_stack_fffffffffffffea0,(bool)measureWallclockTime);
    in_stack_fffffffffffffe98 = local_30;
    in_stack_fffffffffffffea0 = in_stack_00000008;
    remora::kernels::
    conv2d<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::vector<double,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               (size_t)in_stack_fffffffffffffec8,in_stack_ffffffffffffff10,sVar3,filter_width,
               (size_t)pmVar2,in_stack_ffffffffffffff30);
    local_c0[0] = Timer::stop(in_stack_fffffffffffffea0);
    pdVar5 = std::min<double>(local_78,local_c0);
    local_78[0] = *pdVar5;
    local_90[2] = local_90[2] + 1;
  }
  lVar6 = local_38 * local_40 * (long)in_stack_00000008 * (long)in_stack_00000008 * local_20 *
          local_18;
  auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar9._0_8_ = lVar6;
  auVar9._12_4_ = 0x45300000;
  pmVar2 = remora::
           matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_8);
  sVar3 = remora::matrix<double,_remora::row_major,_remora::cpu_tag>::size1(pmVar2);
  auVar10._8_4_ = (int)(sVar3 >> 0x20);
  auVar10._0_8_ = sVar3;
  auVar10._12_4_ = 0x45300000;
  dVar8 = (((auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) *
           ((auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * 0.0009765625 *
          0.0009765625) / local_78[0];
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_38);
  poVar7 = std::operator<<(poVar7,"\t");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(ulong)in_stack_00000008);
  poVar7 = std::operator<<(poVar7,"\t");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
  poVar7 = std::operator<<(poVar7,"\t");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_20);
  std::operator<<(poVar7,"\t");
  poVar7 = std::operator<<((ostream *)&std::cout,"\t");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar8);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  remora::matrix<double,_remora::row_major,_remora::cpu_tag>::~matrix
            ((matrix<double,_remora::row_major,_remora::cpu_tag> *)0x10e216);
  return;
}

Assistant:

void benchmark(
	matrix_expression<E1, cpu_tag> const& image,
	vector_expression<E2, cpu_tag> const& filter,
	std::size_t num_channels,
	std::size_t num_filters,
	std::size_t image_size1,
	std::size_t image_size2,
	std::size_t filter_size
){
	std::size_t output_size1 = image_size1 - filter_size +1;
	std::size_t output_size2 = image_size2 - filter_size +1;
	typedef typename E1::value_type value_type;

	remora::matrix<value_type> out(image().size1(), output_size1 * num_filters * output_size2, 0.0);
	double minOptTime = std::numeric_limits<double>::max();
	for(std::size_t i = 0; i != std::max<std::size_t>(1, std::size_t(20/image().size1())); ++i){
		Timer time;
		kernels::conv2d(image,filter,out, num_channels, num_filters, image_size1, image_size2, filter_size, filter_size,0,0);
		minOptTime = std::min(minOptTime,time.stop());
	}

	double mults = output_size1 * output_size2 * filter_size * filter_size * num_filters * num_channels;
	double flops = image().size1() * mults /1024/1024/minOptTime;

	std::cout<<output_size1<<"\t"<<filter_size<<"\t"<<num_channels<<"\t"<< num_filters<<"\t";
	std::cout<<"\t"<<flops<< std::endl;
}